

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

void crnlib::LenEnc_Init(CLenEnc *p)

{
  long lVar1;
  
  p->choice = 0x400;
  p->choice2 = 0x400;
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
    p->low[lVar1] = 0x400;
  }
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
    p->mid[lVar1] = 0x400;
  }
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    p->high[lVar1] = 0x400;
  }
  return;
}

Assistant:

static void LenEnc_Init(CLenEnc* p) {
  unsigned i;
  p->choice = p->choice2 = kProbInitValue;
  for (i = 0; i < (LZMA_NUM_PB_STATES_MAX << kLenNumLowBits); i++)
    p->low[i] = kProbInitValue;
  for (i = 0; i < (LZMA_NUM_PB_STATES_MAX << kLenNumMidBits); i++)
    p->mid[i] = kProbInitValue;
  for (i = 0; i < kLenNumHighSymbols; i++)
    p->high[i] = kProbInitValue;
}